

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR InternalSetFilePointerForUnixFd
                    (int iUnixFd,LONG lDistanceToMove,PLONG lpDistanceToMoveHigh,DWORD dwMoveMethod,
                    PLONG lpNewFilePointerLow)

{
  int iVar1;
  int *piVar2;
  __off64_t _Var3;
  undefined1 local_d8 [4];
  int result;
  stat fileData;
  off_t old_offset;
  long seek_res;
  long seek_offset;
  int seek_whence;
  PAL_ERROR palError;
  PLONG lpNewFilePointerLow_local;
  DWORD dwMoveMethod_local;
  PLONG lpDistanceToMoveHigh_local;
  LONG lDistanceToMove_local;
  int iUnixFd_local;
  
  seek_offset._4_4_ = 0;
  if (dwMoveMethod == 0) {
    seek_offset._0_4_ = 0;
  }
  else if (dwMoveMethod == 1) {
    seek_offset._0_4_ = 1;
  }
  else {
    if (dwMoveMethod != 2) {
      if (PAL_InitializeChakraCoreCalled) {
        return 0x57;
      }
      abort();
    }
    seek_offset._0_4_ = 2;
  }
  if (lpDistanceToMoveHigh == (PLONG)0x0) {
    seek_res = (long)lDistanceToMove;
  }
  else {
    seek_res = CONCAT44(*lpDistanceToMoveHigh,lDistanceToMove);
  }
  fileData.__glibc_reserved[2] = lseek64(iUnixFd,0,1);
  if (fileData.__glibc_reserved[2] == -1) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar2 = __errno_location();
    strerror(*piVar2);
    seek_offset._4_4_ = 5;
  }
  else if ((((int)seek_offset == 0) && (seek_res < 0)) ||
          (((int)seek_offset == 1 && (seek_res + fileData.__glibc_reserved[2] < 0)))) {
    seek_offset._4_4_ = 0x83;
  }
  else {
    if (((int)seek_offset == 2) && (seek_res < 0)) {
      iVar1 = fstat64(iUnixFd,(stat64 *)local_d8);
      if (iVar1 == -1) {
        return 5;
      }
      if ((long)fileData.st_rdev < -seek_res) {
        return 0x83;
      }
    }
    _Var3 = lseek64(iUnixFd,seek_res,(int)seek_offset);
    if (_Var3 < 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar2 = __errno_location();
      strerror(*piVar2);
      lseek64(iUnixFd,fileData.__glibc_reserved[2],0);
      seek_offset._4_4_ = 5;
    }
    else {
      if (lpDistanceToMoveHigh != (PLONG)0x0) {
        *lpDistanceToMoveHigh = (LONG)((ulong)_Var3 >> 0x20);
      }
      *lpNewFilePointerLow = (LONG)_Var3;
    }
  }
  return seek_offset._4_4_;
}

Assistant:

PAL_ERROR
InternalSetFilePointerForUnixFd(
    int iUnixFd,
    LONG lDistanceToMove,
    PLONG lpDistanceToMoveHigh,
    DWORD dwMoveMethod,
    PLONG lpNewFilePointerLow
    )
{
    PAL_ERROR palError = NO_ERROR;
    int     seek_whence = 0;
    __int64 seek_offset = 0LL;
    __int64 seek_res = 0LL;
    off_t old_offset;

    switch( dwMoveMethod )
    {
    case FILE_BEGIN:
        seek_whence = SEEK_SET; 
        break;
    case FILE_CURRENT:
        seek_whence = SEEK_CUR; 
        break;
    case FILE_END:
        seek_whence = SEEK_END; 
        break;
    default:
        ERROR("dwMoveMethod = %d is invalid\n", dwMoveMethod);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //
    // According to MSDN, if lpDistanceToMoveHigh is not null, 
    // lDistanceToMove is treated as unsigned; 
    // it is treated as signed otherwise
    //
    
    if ( lpDistanceToMoveHigh )
    {
        /* set the high 32 bits of the offset */
        seek_offset = ((__int64)*lpDistanceToMoveHigh << 32);
        
        /* set the low 32 bits */
        /* cast to unsigned long to avoid sign extension */
        seek_offset |= (ULONG) lDistanceToMove;
    }
    else
    {
        seek_offset |= lDistanceToMove;
    }

    /* store the current position, in case the lseek moves the pointer
       before the beginning of the file */
    old_offset = lseek(iUnixFd, 0, SEEK_CUR);
    if (old_offset == -1)
    {
        ERROR("lseek(fd,0,SEEK_CUR) failed errno:%d (%s)\n", 
              errno, strerror(errno));
        palError = ERROR_ACCESS_DENIED;
        goto done;
    }
    
    // Check to see if we're going to seek to a negative offset.
    // If we're seeking from the beginning or the current mark,
    // this is simple.
    if ((seek_whence == SEEK_SET && seek_offset < 0) ||
        (seek_whence == SEEK_CUR && seek_offset + old_offset < 0))
    {
        palError = ERROR_NEGATIVE_SEEK;
        goto done;
    }
    else if (seek_whence == SEEK_END && seek_offset < 0)
    {
        // We need to determine if we're seeking past the
        // beginning of the file, but we don't want to adjust
        // the mark in the process. stat is the only way to
        // do that.
        struct stat fileData;
        int result;
        
        result = fstat(iUnixFd, &fileData);
        if (result == -1)
        {
            // It's a bad fd. This shouldn't happen because
            // we've already called lseek on it, but you
            // never know. This is the best we can do.
            palError = ERROR_ACCESS_DENIED;
            goto done;
        }
        if (fileData.st_size < -seek_offset)
        {
            // Seeking past the beginning.
            palError = ERROR_NEGATIVE_SEEK;
            goto done;
        }
    }

    seek_res = (__int64)lseek( iUnixFd,
                               seek_offset,
                               seek_whence );
    if ( seek_res < 0 )
    {
        /* lseek() returns -1 on error, but also can seek to negative
           file offsets, so -1 can also indicate a successful seek to offset
           -1.  Win32 doesn't allow negative file offsets, so either case
           is an error. */
        ERROR("lseek failed errno:%d (%s)\n", errno, strerror(errno));
        lseek(iUnixFd, old_offset, SEEK_SET);
        palError = ERROR_ACCESS_DENIED;
    }
    else
    {
        /* store high-order DWORD */
        if ( lpDistanceToMoveHigh )
            *lpDistanceToMoveHigh = (DWORD)(seek_res >> 32);
    
        /* return low-order DWORD of seek result */
        *lpNewFilePointerLow = (DWORD)seek_res;
    }

done:

    return palError;
}